

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O3

StructType * LLVMBC::StructType::get(LLVMContext *context,Vector<Type_*> *member_types)

{
  pointer *pppTVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  iterator __position;
  pointer ppTVar4;
  StructType *pSVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  StructType *local_18;
  
  ppTVar4 = (context->type_cache).
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppTVar4 ==
        (context->type_cache).
        super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar5 = LLVMContext::
               construct<LLVMBC::StructType,LLVMBC::LLVMContext&,std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>>
                         (context,context,member_types);
      __position._M_current =
           (context->type_cache).
           super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (context->type_cache).
          super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_18 = pSVar5;
        std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
        _M_realloc_insert<LLVMBC::Type*>
                  ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)
                   &context->type_cache,__position,(Type **)&local_18);
      }
      else {
        *__position._M_current = &pSVar5->super_Type;
        pppTVar1 = &(context->type_cache).
                    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      return pSVar5;
    }
    pSVar5 = (StructType *)*ppTVar4;
    if ((pSVar5->super_Type).type_id == StructTyID) {
      ppTVar2 = (pSVar5->member_types).
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(pSVar5->member_types).
                    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2;
      uVar8 = uVar6 >> 3;
      uVar7 = uVar8 & 0xffffffff;
      ppTVar3 = (member_types->
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)(member_types->
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>)
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3 == uVar7) {
        if ((int)uVar8 == 0) {
          return pSVar5;
        }
        uVar8 = 0;
        while( true ) {
          if ((long)uVar6 >> 3 == uVar8) {
            __assert_fail("N < member_types.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/bc/type.cpp"
                          ,0xbf,"Type *LLVMBC::StructType::getElementType(unsigned int) const");
          }
          if (ppTVar3[uVar8] != ppTVar2[uVar8]) break;
          uVar8 = uVar8 + 1;
          if (uVar7 == uVar8) {
            return pSVar5;
          }
        }
      }
    }
    ppTVar4 = ppTVar4 + 1;
  } while( true );
}

Assistant:

StructType *StructType::get(LLVMContext &context, Vector<Type *> member_types)
{
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
	{
		if (type->getTypeID() == TypeID::StructTyID)
		{
			auto *struct_type = cast<StructType>(type);
			if (struct_type->getNumElements() == member_types.size())
			{
				bool equal = true;
				unsigned count = member_types.size();
				for (unsigned i = 0; i < count; i++)
				{
					if (member_types[i] != struct_type->getElementType(i))
					{
						equal = false;
						break;
					}
				}

				if (equal)
					return struct_type;
			}
		}
	}

	auto *type = context.construct<StructType>(context, std::move(member_types));
	cache.push_back(type);
	return type;
}